

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
          (undefined8 param_1,short_string_storage *param_2)

{
  bool_storage *this;
  short_string_storage temp;
  short_string_storage *in_stack_ffffffffffffffb8;
  short_string_storage *in_stack_ffffffffffffffc0;
  
  cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc0);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::short_string_storage::
  short_string_storage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this = cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage>
                   ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (bool_storage *)param_2);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             param_2);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }